

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscroll.c
# Opt level: O0

void Scroll(DspInterface dsp,int newX,int newY)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int newY_local;
  int newX_local;
  DspInterface dsp_local;
  
  iVar3 = sbound(0,newX,(dsp->Display).width - (dsp->Visible).width);
  (dsp->Visible).x = iVar3;
  iVar3 = sbound(0,newY,(dsp->Display).height - (dsp->Visible).height);
  (dsp->Visible).y = iVar3;
  iVar3 = (dsp->Visible).y;
  uVar1 = (dsp->Visible).height;
  uVar2 = (dsp->Display).height;
  XMoveWindow(dsp->display_id,dsp->HorScrollButton,
              (int)((dsp->Visible).x * (dsp->Visible).width) / (int)(dsp->Display).width,
              -dsp->InternalBorderWidth);
  XMoveWindow(dsp->display_id,dsp->VerScrollButton,-dsp->InternalBorderWidth,
              (int)(iVar3 * uVar1) / (int)uVar2);
  (*dsp->bitblt_to_screen)
            (dsp,(DLword *)0x0,(dsp->Visible).x,(dsp->Visible).y,(dsp->Visible).width,
             (dsp->Visible).height);
  return;
}

Assistant:

void Scroll(DspInterface dsp, int newX, int newY)
{
  /* Limit the newX and newY values. */
  dsp->Visible.x = sbound(0, newX, dsp->Display.width - dsp->Visible.width);
  dsp->Visible.y = sbound(0, newY, dsp->Display.height - dsp->Visible.height);

  newX = (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width;
  newY = (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height;

  XMoveWindow(dsp->display_id, dsp->HorScrollButton, newX, -(int)dsp->InternalBorderWidth);
  XMoveWindow(dsp->display_id, dsp->VerScrollButton, -(int)dsp->InternalBorderWidth, newY);

  (dsp->bitblt_to_screen)(dsp, 0, dsp->Visible.x, dsp->Visible.y, dsp->Visible.width,
                          dsp->Visible.height);
}